

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_gather.c
# Opt level: O0

REF_STATUS
ref_gather_scalar_cell_solb(REF_GRID ref_grid,REF_INT ldim,REF_DBL *scalar,char *filename)

{
  uint uVar1;
  REF_STATUS RVar2;
  size_t sVar3;
  long lVar4;
  long lVar5;
  size_t sVar6;
  int iVar7;
  REF_STATUS ref_private_macro_code_rss_13;
  REF_LONG ref_private_status_reis_bi_12;
  REF_LONG ref_private_status_reis_ai_12;
  REF_LONG ref_private_status_reis_bi_11;
  REF_LONG ref_private_status_reis_ai_11;
  REF_STATUS ref_private_macro_code_rss_12;
  REF_STATUS ref_private_macro_code_rss_11;
  REF_STATUS ref_private_macro_code_rss_10;
  REF_LONG ref_private_status_reis_bi_10;
  REF_LONG ref_private_status_reis_ai_10;
  REF_STATUS ref_private_macro_code_rss_9;
  REF_STATUS ref_private_macro_code_rss_8;
  REF_LONG ref_private_status_reis_bi_9;
  REF_LONG ref_private_status_reis_ai_9;
  REF_STATUS ref_private_macro_code_rss_7;
  REF_LONG ref_private_status_reis_bi_8;
  REF_LONG ref_private_status_reis_ai_8;
  REF_LONG ref_private_status_reis_bi_7;
  REF_LONG ref_private_status_reis_ai_7;
  REF_LONG ref_private_status_reis_bi_6;
  REF_LONG ref_private_status_reis_ai_6;
  REF_STATUS ref_private_macro_code_rss_6;
  REF_LONG ref_private_status_reis_bi_5;
  REF_LONG ref_private_status_reis_ai_5;
  REF_STATUS ref_private_macro_code_rss_5;
  REF_STATUS ref_private_macro_code_rss_4;
  REF_LONG ref_private_status_reis_bi_4;
  REF_LONG ref_private_status_reis_ai_4;
  REF_LONG ref_private_status_reis_bi_3;
  REF_LONG ref_private_status_reis_ai_3;
  REF_STATUS ref_private_macro_code_rss_3;
  REF_LONG ref_private_status_reis_bi_2;
  REF_LONG ref_private_status_reis_ai_2;
  REF_LONG ref_private_status_reis_bi_1;
  REF_LONG ref_private_status_reis_ai_1;
  REF_LONG ref_private_status_reis_bi;
  REF_LONG ref_private_status_reis_ai;
  REF_STATUS ref_private_macro_code_rss_2;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  REF_LONG ncell_recv;
  int local_130;
  REF_INT proc;
  REF_INT j;
  REF_INT node;
  REF_DBL *data;
  REF_DBL cell_average;
  REF_INT nodes [27];
  int local_a0;
  int local_9c;
  REF_INT cell;
  REF_INT part;
  REF_FILEPOS next_position;
  REF_INT ncell_int;
  REF_INT header_size;
  REF_INT i;
  int cell_keyword;
  int dim;
  int keyword_code;
  int code;
  int version;
  REF_LONG npri;
  REF_LONG ntet;
  REF_LONG ncell;
  REF_LONG ncell_local;
  REF_MPI ref_mpi;
  REF_CELL ref_cell;
  REF_NODE ref_node;
  FILE *file;
  char *filename_local;
  REF_DBL *scalar_local;
  REF_GRID pRStack_18;
  REF_INT ldim_local;
  REF_GRID ref_grid_local;
  
  ref_cell = (REF_CELL)ref_grid->node;
  ref_mpi = (REF_MPI)0x0;
  ncell_local = (REF_LONG)ref_grid->mpi;
  _cell = 0;
  file = (FILE *)filename;
  filename_local = (char *)scalar;
  scalar_local._4_4_ = ldim;
  pRStack_18 = ref_grid;
  uVar1 = ref_node_synchronize_globals((REF_NODE)ref_cell);
  if (uVar1 == 0) {
    uVar1 = ref_cell_ncell(pRStack_18->cell[8],(REF_NODE)ref_cell,&npri);
    if (uVar1 == 0) {
      uVar1 = ref_cell_ncell(pRStack_18->cell[10],(REF_NODE)ref_cell,(REF_LONG *)&code);
      if (uVar1 == 0) {
        header_size = -1;
        if ((0 < npri) && (_code == 0)) {
          header_size = 0x42;
          ref_mpi = (REF_MPI)pRStack_18->cell[8];
        }
        if ((npri == 0) && (0 < _code)) {
          header_size = 0x43;
          ref_mpi = (REF_MPI)pRStack_18->cell[10];
        }
        if (header_size == -1) {
          printf("%s: %d: %s: %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
                 0xc6e,"ref_gather_scalar_cell_solb","grid must be all tet or all prism");
          ref_grid_local._4_4_ = 1;
        }
        else {
          ref_node = (REF_NODE)0x0;
          if (pRStack_18->mpi->id == 0) {
            ref_node = (REF_NODE)fopen((char *)file,"w");
            if ((FILE *)ref_node == (FILE *)0x0) {
              printf("unable to open %s\n",file);
            }
            if (ref_node == (REF_NODE)0x0) {
              printf("%s: %d: %s: %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                     ,0xc74,"ref_gather_scalar_cell_solb","unable to open file");
              return 2;
            }
          }
          if (npri + _code < 0x989681) {
            keyword_code = 2;
            next_position._4_4_ = 0xc;
          }
          else {
            keyword_code = 3;
            next_position._4_4_ = 0x10;
          }
          if (*(int *)(ncell_local + 4) == 0) {
            dim = 1;
            sVar3 = fwrite(&dim,4,1,(FILE *)ref_node);
            if (sVar3 != 1) {
              printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                     ,0xc81,"ref_gather_scalar_cell_solb","code",1,sVar3);
              return 1;
            }
            sVar3 = fwrite(&keyword_code,4,1,(FILE *)ref_node);
            if (sVar3 != 1) {
              printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                     ,0xc82,"ref_gather_scalar_cell_solb","version",1,sVar3);
              return 1;
            }
            lVar4 = (long)next_position._4_4_;
            _cell = ftell((FILE *)ref_node);
            _cell = lVar4 + _cell;
            cell_keyword = 3;
            sVar3 = fwrite(&cell_keyword,4,1,(FILE *)ref_node);
            if (sVar3 != 1) {
              printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                     ,0xc85,"ref_gather_scalar_cell_solb","dim code",1,sVar3);
              return 1;
            }
            uVar1 = ref_export_meshb_next_position((FILE *)ref_node,keyword_code,_cell);
            if (uVar1 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                     ,0xc86,"ref_gather_scalar_cell_solb",(ulong)uVar1,"next p");
              return uVar1;
            }
            i = 3;
            sVar3 = fwrite(&i,4,1,(FILE *)ref_node);
            lVar4 = _cell;
            if (sVar3 != 1) {
              printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                     ,0xc88,"ref_gather_scalar_cell_solb","dim",1,sVar3);
              return 1;
            }
            lVar5 = ftell((FILE *)ref_node);
            if (lVar4 != lVar5) {
              printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                     ,0xc89,"ref_gather_scalar_cell_solb","dim inconsistent",lVar4,lVar5);
              return 1;
            }
          }
          ncell = 0;
          for (local_a0 = 0; local_a0 < ref_mpi->debug; local_a0 = local_a0 + 1) {
            RVar2 = ref_cell_nodes((REF_CELL)ref_mpi,local_a0,(REF_INT *)&cell_average);
            if (RVar2 == 0) {
              uVar1 = ref_cell_part((REF_CELL)ref_mpi,(REF_NODE)ref_cell,local_a0,&local_9c);
              if (uVar1 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                       ,0xc8e,"ref_gather_scalar_cell_solb",(ulong)uVar1,"part");
                return uVar1;
              }
              if (*(int *)(ncell_local + 4) == local_9c) {
                ncell = ncell + 1;
              }
            }
          }
          ntet = ncell;
          uVar1 = ref_mpi_allsum((REF_MPI)ncell_local,&ntet,1,2);
          if (uVar1 == 0) {
            if (ntet < 0x7fffffff) {
              if (*(int *)(ncell_local + 4) == 0) {
                lVar4 = (long)next_position._4_4_;
                iVar7 = scalar_local._4_4_ * 4;
                lVar5 = ntet * (scalar_local._4_4_ << 3);
                _cell = ftell((FILE *)ref_node);
                _cell = lVar4 + (iVar7 + 4) + lVar5 + _cell;
                cell_keyword = header_size;
                sVar3 = fwrite(&cell_keyword,4,1,(FILE *)ref_node);
                if (sVar3 != 1) {
                  printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                         ,0xc9d,"ref_gather_scalar_cell_solb","keyword code",1,sVar3);
                  return 1;
                }
                uVar1 = ref_export_meshb_next_position((FILE *)ref_node,keyword_code,_cell);
                if (uVar1 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                         ,0xc9e,"ref_gather_scalar_cell_solb",(ulong)uVar1,"next p");
                  return uVar1;
                }
                next_position._0_4_ = (undefined4)ntet;
                sVar3 = fwrite(&next_position,4,1,(FILE *)ref_node);
                if (sVar3 != 1) {
                  printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                         ,0xca0,"ref_gather_scalar_cell_solb","nnode",1,sVar3);
                  return 1;
                }
                cell_keyword = scalar_local._4_4_;
                sVar3 = fwrite(&cell_keyword,4,1,(FILE *)ref_node);
                if (sVar3 != 1) {
                  printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                         ,0xca2,"ref_gather_scalar_cell_solb","n solutions",1,sVar3);
                  return 1;
                }
                cell_keyword = 1;
                for (ncell_int = 0; ncell_int < scalar_local._4_4_; ncell_int = ncell_int + 1) {
                  sVar3 = fwrite(&cell_keyword,4,1,(FILE *)ref_node);
                  if (sVar3 != 1) {
                    printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                           ,0xca5,"ref_gather_scalar_cell_solb","scalar",1,sVar3);
                    return 1;
                  }
                }
              }
              if (*(int *)(ncell_local + 4) == 0) {
                for (local_a0 = 0; local_a0 < ref_mpi->debug; local_a0 = local_a0 + 1) {
                  RVar2 = ref_cell_nodes((REF_CELL)ref_mpi,local_a0,(REF_INT *)&cell_average);
                  if (RVar2 == 0) {
                    uVar1 = ref_cell_part((REF_CELL)ref_mpi,(REF_NODE)ref_cell,local_a0,&local_9c);
                    if (uVar1 != 0) {
                      printf("%s: %d: %s: %d %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                             ,0xcab,"ref_gather_scalar_cell_solb",(ulong)uVar1,"part");
                      return uVar1;
                    }
                    if (*(int *)(ncell_local + 4) == local_9c) {
                      for (ncell_int = 0; ncell_int < scalar_local._4_4_; ncell_int = ncell_int + 1)
                      {
                        data = (REF_DBL *)0x0;
                        for (proc = 0; proc < *(int *)&ref_mpi->field_0xc; proc = proc + 1) {
                          data = (REF_DBL *)
                                 (*(double *)
                                   (filename_local +
                                   (long)(ncell_int + scalar_local._4_4_ * nodes[(long)proc + -2]) *
                                   8) + (double)data);
                        }
                        data = (REF_DBL *)((double)data / (double)*(int *)&ref_mpi->field_0xc);
                        sVar3 = fwrite(&data,8,1,(FILE *)ref_node);
                        if (sVar3 != 1) {
                          printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                                 ,0xcb2,"ref_gather_scalar_cell_solb","cell avg",1,sVar3);
                          return 1;
                        }
                      }
                    }
                  }
                }
                for (ncell_recv._4_4_ = 1; ncell_recv._4_4_ < *(int *)ncell_local;
                    ncell_recv._4_4_ = ncell_recv._4_4_ + 1) {
                  uVar1 = ref_mpi_gather_recv((REF_MPI)ncell_local,&ref_private_macro_code_rss_1,1,2
                                              ,ncell_recv._4_4_);
                  if (uVar1 != 0) {
                    printf("%s: %d: %s: %d %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                           ,0xcb8,"ref_gather_scalar_cell_solb",(ulong)uVar1,"recv ncell");
                    return uVar1;
                  }
                  if (0 < _ref_private_macro_code_rss_1) {
                    if (scalar_local._4_4_ * _ref_private_macro_code_rss_1 < 0) {
                      printf("%s: %d: %s: %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                             ,0xcba,"ref_gather_scalar_cell_solb","malloc data of REF_DBL negative")
                      ;
                      return 1;
                    }
                    _j = malloc(scalar_local._4_4_ * _ref_private_macro_code_rss_1 * 8);
                    if (_j == (void *)0x0) {
                      printf("%s: %d: %s: %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                             ,0xcba,"ref_gather_scalar_cell_solb","malloc data of REF_DBL NULL");
                      return 2;
                    }
                    uVar1 = ref_mpi_gather_recv((REF_MPI)ncell_local,_j,
                                                scalar_local._4_4_ *
                                                (int)_ref_private_macro_code_rss_1,3,
                                                ncell_recv._4_4_);
                    if (uVar1 != 0) {
                      printf("%s: %d: %s: %d %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                             ,0xcbd,"ref_gather_scalar_cell_solb",(ulong)uVar1,"send data");
                      return uVar1;
                    }
                    sVar3 = scalar_local._4_4_ * _ref_private_macro_code_rss_1;
                    sVar6 = fwrite(_j,8,scalar_local._4_4_ * _ref_private_macro_code_rss_1,
                                   (FILE *)ref_node);
                    if (sVar3 != sVar6) {
                      printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                             ,0xcc0,"ref_gather_scalar_cell_solb","worker cell avg",sVar3,sVar6);
                      return 1;
                    }
                    if (_j != (void *)0x0) {
                      free(_j);
                    }
                  }
                }
              }
              else {
                uVar1 = ref_mpi_gather_send((REF_MPI)ncell_local,&ncell,1,2);
                if (uVar1 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                         ,0xcc6,"ref_gather_scalar_cell_solb",(ulong)uVar1,"send ncell");
                  return uVar1;
                }
                if (0 < ncell) {
                  if (scalar_local._4_4_ * ncell < 0) {
                    printf("%s: %d: %s: %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                           ,0xcc8,"ref_gather_scalar_cell_solb","malloc data of REF_DBL negative");
                    return 1;
                  }
                  _j = malloc(scalar_local._4_4_ * ncell * 8);
                  if (_j == (void *)0x0) {
                    printf("%s: %d: %s: %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                           ,0xcc8,"ref_gather_scalar_cell_solb","malloc data of REF_DBL NULL");
                    return 2;
                  }
                  local_130 = 0;
                  for (local_a0 = 0; local_a0 < ref_mpi->debug; local_a0 = local_a0 + 1) {
                    RVar2 = ref_cell_nodes((REF_CELL)ref_mpi,local_a0,(REF_INT *)&cell_average);
                    if (RVar2 == 0) {
                      uVar1 = ref_cell_part((REF_CELL)ref_mpi,(REF_NODE)ref_cell,local_a0,&local_9c)
                      ;
                      if (uVar1 != 0) {
                        printf("%s: %d: %s: %d %s\n",
                               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                               ,0xccb,"ref_gather_scalar_cell_solb",(ulong)uVar1,"part");
                        return uVar1;
                      }
                      if (*(int *)(ncell_local + 4) == local_9c) {
                        for (ncell_int = 0; ncell_int < scalar_local._4_4_;
                            ncell_int = ncell_int + 1) {
                          data = (REF_DBL *)0x0;
                          for (proc = 0; proc < *(int *)&ref_mpi->field_0xc; proc = proc + 1) {
                            data = (REF_DBL *)
                                   (*(double *)
                                     (filename_local +
                                     (long)(ncell_int + scalar_local._4_4_ * nodes[(long)proc + -2])
                                     * 8) + (double)data);
                          }
                          data = (REF_DBL *)((double)data / (double)*(int *)&ref_mpi->field_0xc);
                          *(REF_DBL **)
                           ((long)_j + (long)(ncell_int + scalar_local._4_4_ * local_130) * 8) =
                               data;
                        }
                        local_130 = local_130 + 1;
                      }
                    }
                  }
                  uVar1 = ref_mpi_gather_send((REF_MPI)ncell_local,_j,
                                              scalar_local._4_4_ * (int)ncell,3);
                  if (uVar1 != 0) {
                    printf("%s: %d: %s: %d %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                           ,0xcda,"ref_gather_scalar_cell_solb",(ulong)uVar1,"send data");
                    return uVar1;
                  }
                  if (_j != (void *)0x0) {
                    free(_j);
                  }
                }
              }
              lVar4 = _cell;
              if ((*(int *)(ncell_local + 4) == 0) &&
                 (lVar5 = ftell((FILE *)ref_node), lVar4 != lVar5)) {
                printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                       ,0xce0,"ref_gather_scalar_cell_solb","solb metric record len inconsistent",
                       lVar4,lVar5);
                ref_grid_local._4_4_ = 1;
              }
              else {
                if (*(int *)(ncell_local + 4) == 0) {
                  cell_keyword = 0x36;
                  sVar3 = fwrite(&cell_keyword,4,1,(FILE *)ref_node);
                  if (sVar3 != 1) {
                    printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                           ,0xce4,"ref_gather_scalar_cell_solb","end kw",1,sVar3);
                    return 1;
                  }
                  _cell = 0;
                  uVar1 = ref_export_meshb_next_position((FILE *)ref_node,keyword_code,0);
                  if (uVar1 != 0) {
                    printf("%s: %d: %s: %d %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                           ,0xce6,"ref_gather_scalar_cell_solb",(ulong)uVar1,"next p");
                    return uVar1;
                  }
                }
                if (pRStack_18->mpi->id == 0) {
                  fclose((FILE *)ref_node);
                }
                ref_grid_local._4_4_ = 0;
              }
            }
            else {
              printf("%s: %d: %s: %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                     ,0xc96,"ref_gather_scalar_cell_solb","requires version 4 solb for 64bit ncell")
              ;
              ref_grid_local._4_4_ = 1;
            }
          }
          else {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                   ,0xc94,"ref_gather_scalar_cell_solb",(ulong)uVar1,"sum");
            ref_grid_local._4_4_ = uVar1;
          }
        }
      }
      else {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
               0xc62,"ref_gather_scalar_cell_solb",(ulong)uVar1,"npri");
        ref_grid_local._4_4_ = uVar1;
      }
    }
    else {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
             0xc61,"ref_gather_scalar_cell_solb",(ulong)uVar1,"ntet");
      ref_grid_local._4_4_ = uVar1;
    }
  }
  else {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",0xc5f,
           "ref_gather_scalar_cell_solb",(ulong)uVar1,"sync");
    ref_grid_local._4_4_ = uVar1;
  }
  return ref_grid_local._4_4_;
}

Assistant:

REF_FCN REF_STATUS ref_gather_scalar_cell_solb(REF_GRID ref_grid, REF_INT ldim,
                                               REF_DBL *scalar,
                                               const char *filename) {
  FILE *file;
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_CELL ref_cell = NULL;
  REF_MPI ref_mpi = ref_grid_mpi(ref_grid);
  REF_LONG ncell_local, ncell, ntet, npri;
  int version, code, keyword_code, dim, cell_keyword;
  REF_INT i, header_size, ncell_int;
  REF_FILEPOS next_position;
  REF_INT part, cell, nodes[REF_CELL_MAX_SIZE_PER];
  REF_DBL cell_average, *data;
  REF_INT node, j, proc;
  REF_LONG ncell_recv;

  next_position = 0;

  RSS(ref_node_synchronize_globals(ref_node), "sync");

  RSS(ref_cell_ncell(ref_grid_tet(ref_grid), ref_node, &ntet), "ntet");
  RSS(ref_cell_ncell(ref_grid_pri(ref_grid), ref_node, &npri), "npri");
  cell_keyword = REF_EMPTY;
  if (ntet > 0 && npri == 0) {
    /* GmfSolAtTetrahedra 113 - 47 = 66 */
    cell_keyword = 66;
    ref_cell = ref_grid_tet(ref_grid);
  }
  if (ntet == 0 && npri > 0) {
    /* GmfSolAtTetrahedra 114 - 47 = 67 */
    cell_keyword = 67;
    ref_cell = ref_grid_pri(ref_grid);
  }
  RUS(REF_EMPTY, cell_keyword, "grid must be all tet or all prism");

  file = NULL;
  if (ref_grid_once(ref_grid)) {
    file = fopen(filename, "w");
    if (NULL == (void *)file) printf("unable to open %s\n", filename);
    RNS(file, "unable to open file");
  }

  if (REF_EXPORT_MESHB_VERTEX_3 < ntet + npri) {
    version = 3;
    header_size = 4 + 8 + 4;
  } else {
    version = 2;
    header_size = 4 + 4 + 4;
  }

  if (ref_mpi_once(ref_mpi)) {
    code = 1;
    REIS(1, fwrite(&code, sizeof(int), 1, file), "code");
    REIS(1, fwrite(&version, sizeof(int), 1, file), "version");
    next_position = (REF_FILEPOS)header_size + ftell(file);
    keyword_code = 3;
    REIS(1, fwrite(&keyword_code, sizeof(int), 1, file), "dim code");
    RSS(ref_export_meshb_next_position(file, version, next_position), "next p");
    dim = 3;
    REIS(1, fwrite(&dim, sizeof(int), 1, file), "dim");
    REIS(next_position, ftell(file), "dim inconsistent");
  }

  ncell_local = 0;
  each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
    RSS(ref_cell_part(ref_cell, ref_node, cell, &part), "part");
    if (ref_mpi_rank(ref_mpi) == part) {
      ncell_local++;
    }
  }
  ncell = ncell_local;
  RSS(ref_mpi_allsum(ref_mpi, &ncell, 1, REF_LONG_TYPE), "sum");

  RAS(ncell < (REF_LONG)REF_INT_MAX, "requires version 4 solb for 64bit ncell");

  if (ref_mpi_once(ref_mpi)) {
    next_position = (REF_FILEPOS)header_size + (REF_FILEPOS)(4 + (ldim * 4)) +
                    (REF_FILEPOS)ncell * (REF_FILEPOS)(ldim * 8) + ftell(file);
    /* GmfSolAtTetrahedra 113 - 47 = 66 */
    keyword_code = cell_keyword;
    REIS(1, fwrite(&keyword_code, sizeof(int), 1, file), "keyword code");
    RSS(ref_export_meshb_next_position(file, version, next_position), "next p");
    ncell_int = (int)ncell;
    REIS(1, fwrite(&ncell_int, sizeof(int), 1, file), "nnode");
    keyword_code = ldim; /* one solution at node */
    REIS(1, fwrite(&keyword_code, sizeof(int), 1, file), "n solutions");
    keyword_code = 1; /* solution type 1, scalar */
    for (i = 0; i < ldim; i++) {
      REIS(1, fwrite(&keyword_code, sizeof(int), 1, file), "scalar");
    }
  }

  if (ref_mpi_once(ref_mpi)) {
    each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
      RSS(ref_cell_part(ref_cell, ref_node, cell, &part), "part");
      if (ref_mpi_rank(ref_mpi) == part) {
        for (i = 0; i < ldim; i++) {
          cell_average = 0.0;
          for (node = 0; node < ref_cell_node_per(ref_cell); node++)
            cell_average += scalar[i + ldim * nodes[node]];
          cell_average /= (REF_DBL)ref_cell_node_per(ref_cell);
          REIS(1, fwrite(&cell_average, sizeof(REF_DBL), 1, file), "cell avg");
        }
      }
    }
    each_ref_mpi_worker(ref_mpi, proc) {
      RSS(ref_mpi_gather_recv(ref_mpi, &ncell_recv, 1, REF_LONG_TYPE, proc),
          "recv ncell");
      if (ncell_recv > 0) {
        ref_malloc(data, ldim * ncell_recv, REF_DBL);
        RSS(ref_mpi_gather_recv(ref_mpi, data, (REF_INT)(ldim * ncell_recv),
                                REF_DBL_TYPE, proc),
            "send data");
        REIS((size_t)(ldim * ncell_recv),
             fwrite(data, sizeof(REF_DBL), (size_t)(ldim * ncell_recv), file),
             "worker cell avg");
        ref_free(data);
      }
    }
  } else {
    RSS(ref_mpi_gather_send(ref_mpi, &ncell_local, 1, REF_LONG_TYPE),
        "send ncell");
    if (ncell_local > 0) {
      ref_malloc(data, ldim * ncell_local, REF_DBL);
      j = 0;
      each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
        RSS(ref_cell_part(ref_cell, ref_node, cell, &part), "part");
        if (ref_mpi_rank(ref_mpi) == part) {
          for (i = 0; i < ldim; i++) {
            cell_average = 0.0;
            for (node = 0; node < ref_cell_node_per(ref_cell); node++) {
              cell_average += scalar[i + ldim * nodes[node]];
            }
            cell_average /= (REF_DBL)ref_cell_node_per(ref_cell);
            data[i + ldim * j] = cell_average;
          }
          j++;
        }
      }
      RSS(ref_mpi_gather_send(ref_mpi, data, (REF_INT)(ldim * ncell_local),
                              REF_DBL_TYPE),
          "send data");
      ref_free(data);
    }
  }

  if (ref_mpi_once(ref_mpi))
    REIS(next_position, ftell(file), "solb metric record len inconsistent");

  if (ref_mpi_once(ref_mpi)) { /* End */
    keyword_code = 54;
    REIS(1, fwrite(&keyword_code, sizeof(int), 1, file), "end kw");
    next_position = 0;
    RSS(ref_export_meshb_next_position(file, version, next_position), "next p");
  }

  if (ref_grid_once(ref_grid)) fclose(file);

  return REF_SUCCESS;
}